

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O0

void __thiscall TCLAP::SwitchArg::commonProcessing(SwitchArg *this)

{
  CmdLineParseException *pCVar1;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  undefined1 local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  SwitchArg *local_10;
  SwitchArg *this_local;
  
  local_10 = this;
  if (((this->super_Arg)._xorSet & 1U) != 0) {
    local_69 = 1;
    pCVar1 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Mutually exclusive argument already set!",&local_31);
    (*(this->super_Arg)._vptr_Arg[7])(local_68);
    CmdLineParseException::CmdLineParseException(pCVar1,(string *)local_30,local_68);
    local_69 = 0;
    __cxa_throw(pCVar1,&CmdLineParseException::typeinfo,
                CmdLineParseException::~CmdLineParseException);
  }
  if (((this->super_Arg)._alreadySet & 1U) != 0) {
    pCVar1 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Argument already set!",&local_91);
    (*(this->super_Arg)._vptr_Arg[7])(local_b8);
    CmdLineParseException::CmdLineParseException(pCVar1,(string *)local_90,local_b8);
    __cxa_throw(pCVar1,&CmdLineParseException::typeinfo,
                CmdLineParseException::~CmdLineParseException);
  }
  (this->super_Arg)._alreadySet = true;
  if (((this->super_Arg).field_0xa3 & 1) == 1) {
    (this->super_Arg).field_0xa3 = 0;
  }
  else {
    (this->super_Arg).field_0xa3 = 1;
  }
  Arg::_checkWithVisitor(&this->super_Arg);
  return;
}

Assistant:

inline void SwitchArg::commonProcessing()
{
  if ( _xorSet )
    throw(CmdLineParseException(
				"Mutually exclusive argument already set!", toString()));

  if ( _alreadySet ) 
    throw(CmdLineParseException("Argument already set!", toString()));

  _alreadySet = true;

  if ( _value == true )
    _value = false;
  else
    _value = true;

  _checkWithVisitor();
}